

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_push_level(Parser *this,bool explicit_flow_chars)

{
  State *pSVar1;
  ulong uVar2;
  Tree *pTVar3;
  size_t sVar4;
  code *pcVar5;
  Location LVar6;
  undefined1 auVar7 [24];
  bool bVar8;
  flag_t fVar9;
  char msg [42];
  char local_78 [56];
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  char *pcStack_28;
  undefined8 local_20;
  
  pSVar1 = this->m_state;
  if ((this->m_stack).m_size == 0) {
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\\';
    local_78[9] = '\\';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78[0xc] = '\0';
    local_78[0xd] = '\0';
    local_78[0xe] = '\0';
    local_78[0xf] = '\0';
    local_78[0x10] = '\0';
    local_78[0x11] = '\0';
    local_78[0x12] = '\0';
    local_78[0x13] = '\0';
    local_78[0x14] = '\0';
    local_78[0x15] = '\0';
    local_78[0x16] = '\0';
    local_78[0x17] = '\0';
    local_78[0x18] = -0x66;
    local_78[0x19] = -0x21;
    local_78[0x1a] = '\x1f';
    local_78[0x1b] = '\0';
    local_78[0x1c] = '\0';
    local_78[0x1d] = '\0';
    local_78[0x1e] = '\0';
    local_78[0x1f] = '\0';
    local_78[0x20] = 'e';
    local_78[0x21] = '\0';
    local_78[0x22] = '\0';
    local_78[0x23] = '\0';
    local_78[0x24] = '\0';
    local_78[0x25] = '\0';
    local_78[0x26] = '\0';
    local_78[0x27] = '\0';
    (*(code *)PTR_error_impl_00240518)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  if (pSVar1 != (this->m_stack).m_stack + ((this->m_stack).m_size - 1)) {
    builtin_strncpy(local_78 + 0x20,"ck.top())",10);
    builtin_strncpy(local_78 + 0x10,"_state == &m_sta",0x10);
    builtin_strncpy(local_78,"check failed: (m",0x10);
    if ((s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    local_40 = 0;
    uStack_38 = 0x771e;
    local_30 = 0;
    pcStack_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_20 = 0x65;
    auVar7 = ZEXT1224(ZEXT412(0x771e) << 0x40);
    LVar6.name.str._0_4_ = 0x1fdf9a;
    LVar6.super_LineCol.offset = auVar7._0_8_;
    LVar6.super_LineCol.line = auVar7._8_8_;
    LVar6.super_LineCol.col = auVar7._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_78,0x2a,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar2 = this->m_state->node_id;
  if (uVar2 != 0xffffffffffffffff) {
    pTVar3 = this->m_tree;
    if (pTVar3->m_cap <= uVar2) {
      if ((s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      local_78[0] = '\0';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[8] = 't';
      local_78[9] = 'K';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[0xc] = '\0';
      local_78[0xd] = '\0';
      local_78[0xe] = '\0';
      local_78[0xf] = '\0';
      local_78[0x10] = '\0';
      local_78[0x11] = '\0';
      local_78[0x12] = '\0';
      local_78[0x13] = '\0';
      local_78[0x14] = '\0';
      local_78[0x15] = '\0';
      local_78[0x16] = '\0';
      local_78[0x17] = '\0';
      local_78[0x18] = -0x66;
      local_78[0x19] = -0x21;
      local_78[0x1a] = '\x1f';
      local_78[0x1b] = '\0';
      local_78[0x1c] = '\0';
      local_78[0x1d] = '\0';
      local_78[0x1e] = '\0';
      local_78[0x1f] = '\0';
      local_78[0x20] = 'e';
      local_78[0x21] = '\0';
      local_78[0x22] = '\0';
      local_78[0x23] = '\0';
      local_78[0x24] = '\0';
      local_78[0x25] = '\0';
      local_78[0x26] = '\0';
      local_78[0x27] = '\0';
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar3->m_buf != (NodeData *)0x0) {
      if ((explicit_flow_chars) || (fVar9 = 2, (this->m_state->flags & 0x10) != 0)) {
        fVar9 = 0x12;
      }
      detail::stack<c4::yml::Parser::State,_16UL>::push_top(&this->m_stack);
      if ((this->m_stack).m_size == 0) {
        if ((s_error_flags & 1) != 0) {
          bVar8 = is_debugger_attached();
          if (bVar8) {
            pcVar5 = (code *)swi(3);
            (*pcVar5)();
            return;
          }
        }
        local_78[0] = '\0';
        local_78[1] = '\0';
        local_78[2] = '\0';
        local_78[3] = '\0';
        local_78[4] = '\0';
        local_78[5] = '\0';
        local_78[6] = '\0';
        local_78[7] = '\0';
        local_78[8] = '\\';
        local_78[9] = '\\';
        local_78[10] = '\0';
        local_78[0xb] = '\0';
        local_78[0xc] = '\0';
        local_78[0xd] = '\0';
        local_78[0xe] = '\0';
        local_78[0xf] = '\0';
        local_78[0x10] = '\0';
        local_78[0x11] = '\0';
        local_78[0x12] = '\0';
        local_78[0x13] = '\0';
        local_78[0x14] = '\0';
        local_78[0x15] = '\0';
        local_78[0x16] = '\0';
        local_78[0x17] = '\0';
        local_78[0x18] = -0x66;
        local_78[0x19] = -0x21;
        local_78[0x1a] = '\x1f';
        local_78[0x1b] = '\0';
        local_78[0x1c] = '\0';
        local_78[0x1d] = '\0';
        local_78[0x1e] = '\0';
        local_78[0x1f] = '\0';
        local_78[0x20] = 'e';
        local_78[0x21] = '\0';
        local_78[0x22] = '\0';
        local_78[0x23] = '\0';
        local_78[0x24] = '\0';
        local_78[0x25] = '\0';
        local_78[0x26] = '\0';
        local_78[0x27] = '\0';
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
      }
      pSVar1 = (this->m_stack).m_stack;
      sVar4 = (this->m_stack).m_size;
      this->m_state = pSVar1 + (sVar4 - 1);
      pSVar1[sVar4 - 1].flags = fVar9;
      pSVar1[sVar4 - 1].node_id = 0xffffffffffffffff;
      pSVar1[sVar4 - 1].indref = 0xffffffffffffffff;
      pSVar1[sVar4 - 1].level = pSVar1[sVar4 - 1].level + 1;
    }
  }
  return;
}

Assistant:

void Parser::_push_level(bool explicit_flow_chars)
{
    _c4dbgpf("pushing level! currnode={}  currlevel={} stacksize={} stackcap={}", m_state->node_id, m_state->level, m_stack.size(), m_stack.capacity());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state == &m_stack.top());
    if(node(m_state) == nullptr)
    {
        _c4dbgp("pushing level! actually no, current node is null");
        //_RYML_CB_ASSERT(m_stack.m_callbacks,  ! explicit_flow_chars);
        return;
    }
    flag_t st = RUNK;
    if(explicit_flow_chars || has_all(FLOW))
    {
        st |= FLOW;
    }
    m_stack.push_top();
    m_state = &m_stack.top();
    set_flags(st);
    m_state->node_id = (size_t)NONE;
    m_state->indref = (size_t)NONE;
    ++m_state->level;
    _c4dbgpf("pushing level: now, currlevel={}", m_state->level);
}